

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
opengv::math::o4_roots(vector<double,_std::allocator<double>_> *__return_storage_ptr__,MatrixXd *p)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  complex<double> w;
  complex<double> Q;
  complex<double> P;
  complex<double> R;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  double local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double local_58;
  double local_50;
  double local_48 [2];
  complex<double> local_38;
  double local_28 [2];
  
  pdVar1 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_50 = *pdVar1;
  local_58 = pdVar1[1];
  dVar18 = pdVar1[2];
  local_a8._0_8_ = 2.0;
  dVar17 = local_50 * local_50;
  dVar3 = local_58 * local_58;
  dVar4 = local_50 * dVar17;
  dVar5 = dVar18 / local_50 - (dVar3 * 3.0) / (dVar17 * 8.0);
  local_78._8_8_ = local_78._0_8_;
  local_78._0_8_ = dVar5;
  dVar2 = pdVar1[3] / local_50 +
          ((local_58 * dVar3) / (dVar4 * 8.0) - (local_58 * dVar18) / (dVar17 + dVar17));
  dVar18 = pdVar1[4] / local_50 +
           (dVar3 * dVar18) / (dVar4 * 16.0) +
           (local_58 * local_58 * dVar3 * 3.0) / (local_50 * dVar4 * -256.0) +
           (local_58 * pdVar1[3]) / (dVar17 * -4.0);
  local_38._M_value._0_8_ = (dVar5 * dVar5) / -12.0 - dVar18;
  local_38._M_value._8_8_ = 0;
  local_48[0] = dVar2 * dVar2 * -0.125;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_48[0];
  local_48[0] = (dVar5 * dVar18) / 3.0 + (dVar5 * dVar5 * dVar5) / -108.0 + local_48[0];
  dVar18 = local_48[0] * -0.5;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar18;
  local_48[1] = 0.0;
  std::pow<double>((complex<double> *)local_48,(double *)local_a8);
  local_80 = 3.0;
  auVar16 = auVar19;
  local_68 = auVar26;
  std::pow<double>(&local_38,&local_80);
  auVar16 = vunpcklpd_avx(auVar16,auVar26);
  auVar15._8_8_ = 0x403b000000000000;
  auVar15._0_8_ = 0x403b000000000000;
  auVar15 = vdivpd_avx512vl(auVar16,auVar15);
  auVar16 = vunpcklpd_avx(auVar19,local_68);
  auVar6._8_8_ = 0x3fd0000000000000;
  auVar6._0_8_ = 0x3fd0000000000000;
  auVar16 = vmulpd_avx512vl(auVar16,auVar6);
  dVar17 = auVar16._0_8_ + auVar15._0_8_;
  local_98._8_8_ = auVar16._8_8_ + auVar15._8_8_;
  local_98._0_8_ = dVar17;
  std::sqrt<double>((complex<double> *)local_98);
  local_28[0] = dVar17 + dVar18;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_28[0];
  local_98._0_8_ = 0.3333333333333333;
  local_28[1] = auVar26._0_8_;
  std::pow<double>((complex<double> *)local_28,(double *)local_98);
  if ((auVar16._0_8_ != 0.0) || (NAN(auVar16._0_8_))) {
    dVar18 = (double)local_78._0_8_ * -5.0;
    auVar15 = vunpcklpd_avx(auVar16,auVar26);
    auVar13._8_8_ = 0x4008000000000000;
    auVar13._0_8_ = 0x4008000000000000;
    local_98._0_16_ = vmulpd_avx512vl(auVar15,auVar13);
    dVar17 = local_98._0_8_;
    local_b8._0_8_ = auVar26._0_8_;
    local_68 = auVar16;
    std::operator/(&local_38,(complex<double> *)local_98);
    dVar18 = (dVar18 / 6.0 - dVar17) + (double)local_68._0_8_;
    local_b8._0_8_ = auVar26._0_8_ - (double)local_b8._0_8_;
  }
  else {
    local_98._0_8_ = 0x3fd5555555555555;
    dVar18 = ((double)local_78._0_8_ * -5.0) / 6.0;
    dVar17 = dVar18;
    std::pow<double>((complex<double> *)local_48,(double *)local_98);
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar16 = vxorpd_avx512vl(auVar26,auVar7);
    local_b8._0_8_ = auVar16._0_8_;
    dVar18 = dVar18 - dVar17;
  }
  local_b8._0_8_ = (double)local_b8._0_8_ + (double)local_b8._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_b8._0_8_;
  dVar17 = dVar18 + dVar18 + (double)local_78._0_8_;
  local_b8._8_8_ = 0;
  local_a8._8_8_ = local_b8._0_8_;
  local_a8._0_8_ = dVar17;
  std::sqrt<double>((complex<double> *)local_a8);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._8_8_ = auVar27._0_8_;
  local_98._0_8_ = dVar17;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dVar2 = dVar2 + dVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar2;
  local_80 = dVar2;
  std::operator/(&local_80,(complex<double> *)local_98);
  auVar16 = vunpcklpd_avx(auVar20,auVar27);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = (double)local_78._0_8_ * 3.0 + dVar18 + dVar18;
  local_78 = vunpcklpd_avx(auVar30,local_b8);
  auVar21._0_8_ = local_78._0_8_ + auVar16._0_8_;
  auVar21._8_8_ = local_78._8_8_ + auVar16._8_8_;
  auVar8._8_8_ = 0x8000000000000000;
  auVar8._0_8_ = 0x8000000000000000;
  local_a8 = vxorpd_avx512vl(auVar21,auVar8);
  dVar18 = local_a8._0_8_;
  std::sqrt<double>((complex<double> *)local_a8);
  auVar28._0_8_ = local_58 / (local_50 * -4.0);
  auVar28._8_8_ = 0;
  local_a8._0_8_ = auVar28._0_8_ + (dVar18 + (double)local_98._0_8_) * 0.5;
  auVar16 = auVar28;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (__return_storage_ptr__,(double *)local_a8);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar2;
  local_80 = dVar2;
  std::operator/(&local_80,(complex<double> *)local_98);
  auVar16 = vunpcklpd_avx(auVar22,auVar16);
  auVar23._0_8_ = auVar16._0_8_ + (double)local_78._0_8_;
  auVar23._8_8_ = auVar16._8_8_ + (double)local_78._8_8_;
  auVar9._8_8_ = 0x8000000000000000;
  auVar9._0_8_ = 0x8000000000000000;
  local_a8 = vxorpd_avx512vl(auVar23,auVar9);
  dVar18 = local_a8._0_8_;
  std::sqrt<double>((complex<double> *)local_a8);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_98._0_8_;
  local_a8._0_8_ = ((double)local_98._0_8_ - dVar18) * 0.5 + auVar28._0_8_;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (__return_storage_ptr__,(double *)local_a8);
  uVar14 = local_98._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2;
  local_80 = dVar2;
  std::operator/(&local_80,(complex<double> *)local_98);
  auVar16 = vunpcklpd_avx(auVar24,auVar29);
  auVar16 = vsubpd_avx(local_78,auVar16);
  auVar10._8_8_ = 0x8000000000000000;
  auVar10._0_8_ = 0x8000000000000000;
  local_a8 = vxorpd_avx512vl(auVar16,auVar10);
  dVar18 = local_a8._0_8_;
  auVar16 = local_78;
  std::sqrt<double>((complex<double> *)local_a8);
  local_a8._0_8_ = (dVar18 - (double)uVar14) * 0.5 + auVar28._0_8_;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (__return_storage_ptr__,(double *)local_a8);
  local_b8._8_8_ = 0;
  local_b8._0_8_ = local_98._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  local_80 = dVar2;
  std::operator/(&local_80,(complex<double> *)local_98);
  auVar16 = vunpcklpd_avx(auVar25,auVar16);
  auVar16 = vsubpd_avx(local_78,auVar16);
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  local_a8 = vxorpd_avx512vl(auVar16,auVar11);
  dVar18 = local_a8._0_8_;
  std::sqrt<double>((complex<double> *)local_a8);
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar16 = vxorpd_avx512vl(local_b8,auVar12);
  local_a8._0_8_ = (auVar16._0_8_ - dVar18) * 0.5 + auVar28._0_8_;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (__return_storage_ptr__,(double *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double>
opengv::math::o4_roots( const Eigen::MatrixXd & p )
{
  double A = p(0,0);
  double B = p(1,0);
  double C = p(2,0);
  double D = p(3,0);
  double E = p(4,0);

  double A_pw2 = A*A;
  double B_pw2 = B*B;
  double A_pw3 = A_pw2*A;
  double B_pw3 = B_pw2*B;
  double A_pw4 = A_pw3*A;
  double B_pw4 = B_pw3*B;

  double alpha = -3*B_pw2/(8*A_pw2)+C/A;
  double beta = B_pw3/(8*A_pw3)-B*C/(2*A_pw2)+D/A;
  double gamma = -3*B_pw4/(256*A_pw4)+B_pw2*C/(16*A_pw3)-B*D/(4*A_pw2)+E/A;

  double alpha_pw2 = alpha*alpha;
  double alpha_pw3 = alpha_pw2*alpha;

  std::complex<double> P (-alpha_pw2/12-gamma,0);
  std::complex<double> Q (-alpha_pw3/108+alpha*gamma/3-pow(beta,2)/8,0);
  std::complex<double> R = -Q/2.0+sqrt(pow(Q,2.0)/4.0+pow(P,3.0)/27.0);

  std::complex<double> U = pow(R,(1.0/3.0));
  std::complex<double> y;

  if (U.real() == 0)
    y = -5.0*alpha/6.0-pow(Q,(1.0/3.0));
  else
    y = -5.0*alpha/6.0-P/(3.0*U)+U;

  std::complex<double> w = sqrt(alpha+2.0*y);

  std::vector<double> realRoots;
  std::complex<double> temp;
  temp = -B/(4.0*A) + 0.5*(w+sqrt(-(3.0*alpha+2.0*y+2.0*beta/w)));
  realRoots.push_back(temp.real());
  temp = -B/(4.0*A) + 0.5*(w-sqrt(-(3.0*alpha+2.0*y+2.0*beta/w)));
  realRoots.push_back(temp.real());
  temp = -B/(4.0*A) + 0.5*(-w+sqrt(-(3.0*alpha+2.0*y-2.0*beta/w)));
  realRoots.push_back(temp.real());
  temp = -B/(4.0*A) + 0.5*(-w-sqrt(-(3.0*alpha+2.0*y-2.0*beta/w)));
  realRoots.push_back(temp.real());

  return realRoots;
}